

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<unsigned_long,_4UL>::freeIfHeapAllocated
          (ArrayWithPreallocation<unsigned_long,_4UL> *this)

{
  if (4 < this->numAllocated) {
    if (this->items != (unsigned_long *)0x0) {
      operator_delete__(this->items);
    }
    this->items = this->space;
    this->numAllocated = 4;
  }
  return;
}

Assistant:

void resetToInternalStorage() noexcept
    {
        items = getPreallocatedSpace();
        numAllocated = preallocatedItems;
    }